

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  GCObject *o;
  Table *events;
  TValue *pTVar1;
  TValue *f;
  uint uVar2;
  TValue *io1;
  int iVar3;
  
  uVar2 = t->tt_;
  iVar3 = 100;
  while (uVar2 != 0x45) {
    f = luaT_gettmbyobj(L,t,TM_NEWINDEX);
    uVar2 = f->tt_;
    if (uVar2 == 0) {
      luaG_typeerror(L,t,"index");
    }
LAB_00111cdd:
    if ((uVar2 & 0xf) == 6) {
      callTM(L,f,t,key,val,0);
      return;
    }
    iVar3 = iVar3 + -1;
    t = f;
    if (iVar3 == 0) {
      luaG_runerror(L,"loop in settable");
    }
  }
  o = (GCObject *)(t->value_).f;
  pTVar1 = luaH_get(&o->h,key);
  if (pTVar1->tt_ != 0) goto LAB_00111d1d;
  events = (o->h).metatable;
  if ((events != (Table *)0x0) && ((events->flags & 2) == 0)) {
    f = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]);
    if (f != (TValue *)0x0) {
      uVar2 = f->tt_;
      goto LAB_00111cdd;
    }
  }
  if (pTVar1 == &luaO_nilobject_) {
    pTVar1 = luaH_newkey(L,&o->h,key);
  }
LAB_00111d1d:
  pTVar1->value_ = val->value_;
  uVar2 = val->tt_;
  pTVar1->tt_ = uVar2;
  (o->h).flags = '\0';
  if ((((uVar2 & 0x40) != 0) && (((byte)(val->value_).f[9] & 3) != 0)) &&
     (((o->gch).marked & 4) != 0)) {
    luaC_barrierback_(L,o);
    return;
  }
  return;
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  int loop;
  for (loop = 0; loop < MAXTAGLOOP; loop++) {
    const TValue *tm;
    if (ttistable(t)) {  /* `t' is a table? */
      Table *h = hvalue(t);
      TValue *oldval = cast(TValue *, luaH_get(h, key));
      /* if previous value is not nil, there must be a previous entry
         in the table; moreover, a metamethod has no relevance */
      if (!ttisnil(oldval) ||
         /* previous value is nil; must check the metamethod */
         ((tm = fasttm(L, h->metatable, TM_NEWINDEX)) == NULL &&
         /* no metamethod; is there a previous entry in the table? */
         (oldval != luaO_nilobject ||
         /* no previous entry; must create one. (The next test is
            always true; we only need the assignment.) */
         (oldval = luaH_newkey(L, h, key), 1)))) {
        /* no metamethod and (now) there is an entry with given key */
        setobj2t(L, oldval, val);  /* assign new value to that entry */
        invalidateTMcache(h);
        luaC_barrierback(L, obj2gco(h), val);
        return;
      }
      /* else will try the metamethod */
    }
    else  /* not a table; check metamethod */
      if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
        luaG_typeerror(L, t, "index");
    /* there is a metamethod */
    if (ttisfunction(tm)) {
      callTM(L, tm, t, key, val, 0);
      return;
    }
    t = tm;  /* else repeat with 'tm' */
  }
  luaG_runerror(L, "loop in settable");
}